

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

qsizetype __thiscall
QtPrivate::count(QtPrivate *this,QStringView haystack,QChar needle,CaseSensitivity cs)

{
  short sVar1;
  long lVar2;
  ulong uVar3;
  undefined6 in_register_0000000a;
  long lVar4;
  ushort uVar5;
  ushort uVar6;
  
  uVar5 = (ushort)haystack.m_data;
  if ((int)CONCAT62(in_register_0000000a,needle.ucs) == 1) {
    if (this != (QtPrivate *)0x0) {
      lVar4 = 0;
      lVar2 = 0;
      do {
        lVar2 = lVar2 + (ulong)(*(ushort *)(haystack.m_size + lVar4) == uVar5);
        lVar4 = lVar4 + 2;
      } while ((long)this * 2 != lVar4);
      return lVar2;
    }
  }
  else {
    uVar3 = (ulong)haystack.m_data & 0xffff;
    sVar1 = (short)((uint)(int)(short)*(ushort *)
                                       (QUnicodeTables::uc_properties +
                                       (ulong)*(ushort *)
                                               (QUnicodeTables::uc_property_trie +
                                               (ulong)(((uint)uVar3 & 0x1f) +
                                                      (uint)*(ushort *)
                                                             (QUnicodeTables::uc_property_trie +
                                                             (uVar3 >> 5) * 2)) * 2) * 0x14 + 0xe)
                   >> 1);
    if ((*(ushort *)
          (QUnicodeTables::uc_properties +
          (ulong)*(ushort *)
                  (QUnicodeTables::uc_property_trie +
                  (ulong)(((uint)uVar3 & 0x1f) +
                         (uint)*(ushort *)(QUnicodeTables::uc_property_trie + (uVar3 >> 5) * 2)) * 2
                  ) * 0x14 + 0xe) & 1) == 0) {
      uVar5 = sVar1 + uVar5;
    }
    else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar1 * 2) == 1) {
      uVar5 = *(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar1 * 2 + 2);
    }
    if (this != (QtPrivate *)0x0) {
      lVar4 = 0;
      lVar2 = 0;
      do {
        uVar6 = *(ushort *)(haystack.m_size + lVar4);
        sVar1 = (short)((uint)(int)(short)*(ushort *)
                                           (QUnicodeTables::uc_properties +
                                           (ulong)*(ushort *)
                                                   (QUnicodeTables::uc_property_trie +
                                                   (ulong)((uVar6 & 0x1f) +
                                                          (uint)*(ushort *)
                                                                 (QUnicodeTables::uc_property_trie +
                                                                 (ulong)(uVar6 >> 5) * 2)) * 2) *
                                           0x14 + 0xe) >> 1);
        if ((*(ushort *)
              (QUnicodeTables::uc_properties +
              (ulong)*(ushort *)
                      (QUnicodeTables::uc_property_trie +
                      (ulong)((uVar6 & 0x1f) +
                             (uint)*(ushort *)
                                    (QUnicodeTables::uc_property_trie + (ulong)(uVar6 >> 5) * 2)) *
                      2) * 0x14 + 0xe) & 1) == 0) {
          uVar6 = sVar1 + uVar6;
        }
        else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar1 * 2) == 1) {
          uVar6 = *(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar1 * 2 + 2);
        }
        lVar2 = lVar2 + (ulong)(uVar6 == uVar5);
        lVar4 = lVar4 + 2;
      } while ((long)this * 2 != lVar4);
      return lVar2;
    }
  }
  return 0;
}

Assistant:

qsizetype QtPrivate::count(QStringView haystack, QChar needle, Qt::CaseSensitivity cs) noexcept
{
    if (cs == Qt::CaseSensitive)
        return std::count(haystack.cbegin(), haystack.cend(), needle);

    needle = foldCase(needle);
    return std::count_if(haystack.cbegin(), haystack.cend(),
                         [needle](const QChar c) { return foldAndCompare(c, needle); });
}